

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Nonnull<const_char_*> failure_msg;
  LimitToken old;
  LimitToken local_2c;
  LogMessageFatal local_28;
  
  pcVar3 = ReadSizeAndPushLimitAndDepth(this,ptr,&local_2c);
  if (pcVar3 != (char *)0x0) {
    iVar1 = this->depth_;
    pcVar3 = MessageLite::_InternalParse(msg,pcVar3,this);
    if (pcVar3 != (char *)0x0) {
      if (iVar1 == this->depth_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                ((long)iVar1,(long)this->depth_,"old_depth == depth_");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                   ,0x1bf,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
      }
    }
    this->depth_ = this->depth_ + 1;
    uVar2 = (this->super_EpsCopyInputStream).limit_ + local_2c.token_;
    (this->super_EpsCopyInputStream).limit_ = uVar2;
    if ((this->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      (this->super_EpsCopyInputStream).limit_end_ =
           (this->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar2 >> 0x1f & uVar2);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ParseContext::ParseMessage(MessageLite* msg, const char* ptr) {
  LimitToken old;
  ptr = ReadSizeAndPushLimitAndDepth(ptr, &old);
  if (ptr == nullptr) return ptr;
  auto old_depth = depth_;
  ptr = msg->_InternalParse(ptr, this);
  if (ptr != nullptr) ABSL_DCHECK_EQ(old_depth, depth_);
  depth_++;
  if (!PopLimit(std::move(old))) return nullptr;
  return ptr;
}